

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numparse_affixes.cpp
# Opt level: O2

NumberParseMatcher * __thiscall
icu_63::numparse::impl::AffixTokenMatcherWarehouse::plusSign(AffixTokenMatcherWarehouse *this)

{
  PlusSignMatcher *pPVar1;
  PlusSignMatcher PStack_68;
  
  PlusSignMatcher::PlusSignMatcher(&PStack_68,this->fSetupData->dfs,true);
  pPVar1 = PlusSignMatcher::operator=(&this->fPlusSign,&PStack_68);
  SymbolMatcher::~SymbolMatcher(&PStack_68.super_SymbolMatcher);
  return (NumberParseMatcher *)pPVar1;
}

Assistant:

NumberParseMatcher& AffixTokenMatcherWarehouse::plusSign() {
    return fPlusSign = {fSetupData->dfs, true};
}